

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRConstantOp * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::allocate<spirv_cross::SPIRConstantOp&>
          (ObjectPool<spirv_cross::SPIRConstantOp> *this,SPIRConstantOp *p)

{
  Vector<spirv_cross::SPIRConstantOp_*> *this_00;
  undefined4 uVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstantOp_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
  _Var2;
  size_t sVar3;
  ulong count;
  _Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false> _Var4;
  SPIRConstantOp *pSVar5;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
  if (sVar3 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>)malloc(count * 0x50);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl ==
        (SPIRConstantOp *)0x0) {
      return (SPIRConstantOp *)0x0;
    }
    SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
      _Var4._M_head_impl =
           (SPIRConstantOp *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.ptr[sVar3] =
             _Var4._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size = sVar3;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
              .buffer_size + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRConstantOp_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false> =
         _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_002a050a;
  }
  else {
    pSVar5 = (this_00->super_VectorView<spirv_cross::SPIRConstantOp_*>).ptr[sVar3 - 1];
  }
  SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_002a050a:
  (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstantOp_0035da08;
  uVar1 = *(undefined4 *)&(p->super_IVariant).field_0xc;
  (pSVar5->super_IVariant).self = (ID)(p->super_IVariant).self.id;
  *(undefined4 *)&(pSVar5->super_IVariant).field_0xc = uVar1;
  (pSVar5->arguments).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar5->arguments).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar5->arguments).stack_storage;
  (pSVar5->arguments).buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=(&pSVar5->arguments,&p->arguments);
  (pSVar5->basetype).id = (p->basetype).id;
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}